

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

void lsvm::system::free_process(process *p)

{
  undefined8 *in_RDI;
  
  current_process = (undefined8 *)in_RDI[1];
  if (current_process != (undefined8 *)0x0) {
    *current_process = *in_RDI;
  }
  *(undefined8 **)*in_RDI = current_process;
  processes_count = processes_count + -1;
  memory::retain(p);
  return;
}

Assistant:

void free_process(process* p){
    current_process = p->next;
    if(current_process != null)
        current_process->prev = p->prev;
    *(p->prev) = current_process;
    --processes_count;
    lsvm::memory::retain(p);
}